

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O0

void __thiscall draco::AttributesEncoder::AddAttributeId(AttributesEncoder *this,int32_t id)

{
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  value_type_conflict1 *unaff_retaddr;
  size_type in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar3 = in_ESI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
  if ((int)sVar1 <= in_ESI) {
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar3);
  *pvVar2 = (int)sVar1 + -1;
  return;
}

Assistant:

void AddAttributeId(int32_t id) {
    point_attribute_ids_.push_back(id);
    if (id >= static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(id + 1, -1);
    }
    point_attribute_to_local_id_map_[id] =
        static_cast<int32_t>(point_attribute_ids_.size()) - 1;
  }